

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O2

void EvpathPreloadHandler
               (CManager cm,CMConnection conn,void *msg_v,void *client_Data,attr_list attrs)

{
  undefined4 uVar1;
  Evpath_RS_Stream RS_Stream;
  code *pcVar2;
  void *pvVar3;
  undefined8 uVar4;
  ulong uVar5;
  size_t sVar6;
  SstStats p_Var7;
  Evpath_RS_Stream p_Var8;
  int iVar9;
  _RSTimestepEntry *p_Var10;
  uint64_t uVar11;
  EvpathCompletionHandle Handle;
  Evpath_RS_Stream Stream;
  undefined1 auVar12 [16];
  
  RS_Stream = *(Evpath_RS_Stream *)((long)msg_v + 0x18);
  p_Var10 = (_RSTimestepEntry *)calloc(1,0x30);
  pcVar2 = *client_Data;
  pvVar3 = RS_Stream->CP_Stream;
  uVar1 = *(undefined4 *)((long)msg_v + 0x10);
  uVar4 = *msg_v;
  uVar11 = writeBlockFingerprint(*(char **)((long)msg_v + 0x20),*(size_t *)((long)msg_v + 8));
  (*pcVar2)(pvVar3,3,"Got a preload message from writer rank %d for timestep %ld, fprint %lx\n",
            uVar1,uVar4,uVar11);
  CMtake_buffer(cm,msg_v);
  uVar5 = *msg_v;
  p_Var10->Timestep = uVar5;
  p_Var10->WriterRank = *(int *)((long)msg_v + 0x10);
  p_Var10->Data = *(char **)((long)msg_v + 0x20);
  sVar6 = *(size_t *)((long)msg_v + 8);
  p_Var10->DataSize = sVar6;
  p_Var7 = RS_Stream->Stats;
  auVar12._8_4_ = (int)sVar6;
  auVar12._0_8_ = sVar6;
  auVar12._12_4_ = (int)(sVar6 >> 0x20);
  p_Var7->DataBytesReceived = sVar6 + p_Var7->DataBytesReceived;
  p_Var7->PreloadBytesReceived = auVar12._8_8_ + p_Var7->PreloadBytesReceived;
  if (RS_Stream->LastPreloadTimestep < uVar5) {
    RS_Stream->LastPreloadTimestep = uVar5;
    p_Var7->PreloadTimestepsReceived = p_Var7->PreloadTimestepsReceived + 1;
  }
  pthread_mutex_lock((pthread_mutex_t *)&RS_Stream->DataLock);
  p_Var10->Next = RS_Stream->QueuedTimesteps;
  RS_Stream->QueuedTimesteps = p_Var10;
  p_Var8 = (Evpath_RS_Stream)RS_Stream->PendingReadRequests;
  while (Stream = p_Var8, Stream != (Evpath_RS_Stream)0x0) {
    p_Var8 = *(Evpath_RS_Stream *)&Stream->Rank;
    iVar9 = HandleRequestWithPreloaded
                      ((CP_Services)client_Data,RS_Stream,*(int *)((long)&Stream->DataLock + 0x14),
                       *msg_v,(size_t)(Stream->DataLock).__data.__list.__prev,
                       (size_t)(Stream->DataLock).__data.__list.__next,
                       *(void **)((long)&Stream->DataLock + 8));
    if (iVar9 != 0) {
      CMCondition_signal(cm,*(undefined4 *)&Stream->cm);
      RemoveRequestFromList((CP_Services)RS_Stream,Stream,Handle);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&RS_Stream->DataLock);
  return;
}

Assistant:

static void EvpathPreloadHandler(CManager cm, CMConnection conn, void *msg_v, void *client_Data,
                                 attr_list attrs)
{
    EvpathPreloadMsg PreloadMsg = (EvpathPreloadMsg)msg_v;
    Evpath_RS_Stream RS_Stream = PreloadMsg->RS_Stream;
    CP_Services Svcs = (CP_Services)client_Data;
    RSTimestepList Entry = calloc(1, sizeof(*Entry));

    Svcs->verbose(RS_Stream->CP_Stream, DPPerStepVerbose,
                  "Got a preload message from writer rank %d for timestep %ld, fprint "
                  "%lx\n",
                  PreloadMsg->WriterRank, PreloadMsg->Timestep,
                  writeBlockFingerprint(PreloadMsg->Data, PreloadMsg->DataLength));
    /* arrange for this message data to stay around */
    CMtake_buffer(cm, msg_v);

    Entry->Timestep = PreloadMsg->Timestep;
    Entry->WriterRank = PreloadMsg->WriterRank;
    Entry->Data = PreloadMsg->Data;
    Entry->DataSize = PreloadMsg->DataLength;
    Entry->DataStart = 0;
    RS_Stream->Stats->DataBytesReceived += PreloadMsg->DataLength;
    RS_Stream->Stats->PreloadBytesReceived += PreloadMsg->DataLength;
    if (PreloadMsg->Timestep > RS_Stream->LastPreloadTimestep)
    {
        // only incremenet PreloadTimesteps once, even if we get multiple
        // preloads on a timestep (from different ranks)
        RS_Stream->LastPreloadTimestep = PreloadMsg->Timestep;
        RS_Stream->Stats->PreloadTimestepsReceived++;
    }
    pthread_mutex_lock(&RS_Stream->DataLock);
    Entry->Next = RS_Stream->QueuedTimesteps;
    RS_Stream->QueuedTimesteps = Entry;
    EvpathCompletionHandle Requests = RS_Stream->PendingReadRequests;
    while (Requests)
    {
        int HadPreload;
        EvpathCompletionHandle Next = Requests->Next;
        HadPreload =
            HandleRequestWithPreloaded(Svcs, RS_Stream, Requests->Rank, PreloadMsg->Timestep,
                                       Requests->Offset, Requests->Length, Requests->Buffer);
        if (HadPreload)
        {
            CMCondition_signal(cm, Requests->CMcondition);
            RemoveRequestFromList(Svcs, RS_Stream, Requests);
        }
        Requests = Next;
    }
    pthread_mutex_unlock(&RS_Stream->DataLock);
    return;
}